

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

void __thiscall spdlog::details::file_helper::~file_helper(file_helper *this)

{
  int in_ESI;
  file_helper *in_RDI;
  
  close(in_RDI,in_ESI);
  file_event_handlers::~file_event_handlers((file_event_handlers *)in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  return;
}

Assistant:

SPDLOG_INLINE file_helper::~file_helper() { close(); }